

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

int google::protobuf::compiler::java::GetExperimentalJavaFieldTypeForSingular
              (FieldDescriptor *field)

{
  int iVar1;
  int iVar2;
  FieldDescriptor *local_18;
  _func_void_FieldDescriptor_ptr *local_10;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_10 = FieldDescriptor::TypeOnceInit;
    local_18 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_10,&local_18);
  }
  iVar1 = *(int *)(field + 0x38);
  iVar2 = 0x11;
  if (iVar1 != 10) {
    if (iVar1 < 10) {
      iVar2 = iVar1 + -1;
    }
    else {
      iVar2 = iVar1 + -2;
    }
  }
  return iVar2;
}

Assistant:

int GetExperimentalJavaFieldTypeForSingular(const FieldDescriptor* field) {
  // j/c/g/protobuf/FieldType.java lists field types in a slightly different
  // order from FieldDescriptor::Type so we can't do a simple cast.
  //
  // TODO(xiaofeng): Make j/c/g/protobuf/FieldType.java follow the same order.
  int result = field->type();
  if (result == FieldDescriptor::TYPE_GROUP) {
    return 17;
  } else if (result < FieldDescriptor::TYPE_GROUP) {
    return result - 1;
  } else {
    return result - 2;
  }
}